

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

TimeZoneRule *
icu_63::createRuleByRDATE
          (UnicodeString *zonename,int32_t rawOffset,int32_t dstSavings,UDate start,UVector *dates,
          int32_t fromOffset,UErrorCode *status)

{
  int numStartTimes;
  UDate *startTimes;
  UnicodeString *str;
  TimeArrayTimeZoneRule *pTVar1;
  undefined4 in_register_00000034;
  ulong size;
  long lVar2;
  long lVar3;
  UDate UVar4;
  UDate local_38;
  
  size = CONCAT44(in_register_00000034,rawOffset);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    numStartTimes = dates->count;
    lVar2 = (long)numStartTimes;
    local_38 = start;
    if (lVar2 == 0) {
      pTVar1 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,size);
      if (pTVar1 != (TimeArrayTimeZoneRule *)0x0) {
        TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
                  (pTVar1,zonename,rawOffset,dstSavings,&local_38,1,UTC_TIME);
        return &pTVar1->super_TimeZoneRule;
      }
    }
    else {
      startTimes = (UDate *)uprv_malloc_63(lVar2 * 8);
      if (startTimes != (UDate *)0x0) {
        if (0 < numStartTimes) {
          lVar3 = 0;
          do {
            str = (UnicodeString *)UVector::elementAt(dates,(int32_t)lVar3);
            size = (ulong)(uint)fromOffset;
            UVar4 = parseDateTimeString(str,fromOffset,status);
            startTimes[lVar3] = UVar4;
            if (U_ZERO_ERROR < *status) {
              uprv_free_63(startTimes);
              return (TimeZoneRule *)0x0;
            }
            lVar3 = lVar3 + 1;
          } while (lVar2 != lVar3);
        }
        pTVar1 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,size);
        if (pTVar1 == (TimeArrayTimeZoneRule *)0x0) {
          pTVar1 = (TimeArrayTimeZoneRule *)0x0;
        }
        else {
          TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
                    (pTVar1,zonename,rawOffset,dstSavings,startTimes,numStartTimes,UTC_TIME);
        }
        uprv_free_63(startTimes);
        return &pTVar1->super_TimeZoneRule;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return (TimeZoneRule *)0x0;
}

Assistant:

static TimeZoneRule* createRuleByRDATE(const UnicodeString& zonename, int32_t rawOffset, int32_t dstSavings,
                                       UDate start, UVector* dates, int32_t fromOffset, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    TimeArrayTimeZoneRule *retVal = NULL;
    if (dates == NULL || dates->size() == 0) {
        // When no RDATE line is provided, use start (DTSTART)
        // as the transition time
        retVal = new TimeArrayTimeZoneRule(zonename, rawOffset, dstSavings,
            &start, 1, DateTimeRule::UTC_TIME);
    } else {
        // Create an array of transition times
        int32_t size = dates->size();
        UDate* times = (UDate*)uprv_malloc(sizeof(UDate) * size);
        if (times == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        for (int32_t i = 0; i < size; i++) {
            UnicodeString *datestr = (UnicodeString*)dates->elementAt(i);
            times[i] = parseDateTimeString(*datestr, fromOffset, status);
            if (U_FAILURE(status)) {
                uprv_free(times);
                return NULL;
            }
        }
        retVal = new TimeArrayTimeZoneRule(zonename, rawOffset, dstSavings,
            times, size, DateTimeRule::UTC_TIME);
        uprv_free(times);
    }
    return retVal;
}